

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Encode_Test::TestBody
          (EncodeDecodeTest_Encode_Test *this)

{
  char *pcVar1;
  ParamType *pPVar2;
  string *filename;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  string args;
  string golden_path;
  string local_110;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  AlphaNum local_d0;
  string local_a0;
  undefined1 local_80 [48];
  AlphaNum local_50;
  
  TestTempDir_abi_cxx11_();
  local_80._0_8_ = local_d0.piece_._M_str;
  local_80._8_8_ = local_d0.piece_._M_len;
  local_50.piece_._M_len = 0xf;
  local_50.piece_._M_str = "/golden_message";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_a0,(lts_20250127 *)local_80,&local_50,(AlphaNum *)local_d0.piece_._M_str);
  pcVar1 = local_d0.digits_;
  if ((char *)local_d0.piece_._M_len != pcVar1) {
    operator_delete((void *)local_d0.piece_._M_len,
                    CONCAT71(local_d0.digits_._1_7_,local_d0.digits_[0]) + 1);
  }
  WriteGoldenMessage(&local_a0);
  TestSourceDir_abi_cxx11_();
  filename = (string *)local_80;
  local_80._0_8_ = local_110._M_string_length;
  local_80._8_8_ = local_110._M_dataplus._M_p;
  local_50.piece_._M_len = 1;
  local_50.piece_._M_str = "/";
  local_d0.piece_._M_len = 0x48;
  local_d0.piece_._M_str =
       "google/protobuf/testdata/text_format_unittest_data_oneof_implemented.txt";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_f0,(lts_20250127 *)filename,&local_50,&local_d0,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    filename = (string *)(local_110.field_2._M_allocated_capacity + 1);
    operator_delete(local_110._M_dataplus._M_p,(ulong)filename);
  }
  EncodeDecodeTest::RedirectStdinFromFile
            ((EncodeDecodeTest *)CONCAT71(local_f0._1_7_,local_f0[0]),filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_f0._1_7_,local_f0[0]) != &local_e0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_f0._1_7_,local_f0[0]),local_e0._M_allocated_capacity + 1);
  }
  local_d0.piece_._M_str = (char *)0x0;
  local_d0.digits_[0] = '\0';
  local_d0.piece_._M_len = (size_t)pcVar1;
  pPVar2 = testing::
           WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
           ::GetParam();
  if (*pPVar2 != DESCRIPTOR_SET_IN) {
    std::__cxx11::string::append((char *)&local_d0);
  }
  local_80._0_8_ = local_d0.piece_._M_str;
  local_80._8_8_ = local_d0.piece_._M_len;
  local_50.piece_._M_len = 0x26;
  local_50.piece_._M_str = " --encode=proto2_unittest.TestAllTypes";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_110,(lts_20250127 *)local_80,&local_50,(AlphaNum *)local_d0.piece_._M_str);
  local_f0[0] = (internal)EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_110,true);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == &local_110.field_2) {
    if ((bool)local_f0[0]) goto LAB_00a18f6b;
  }
  else {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    if (((byte)local_f0[0] & 1) != 0) goto LAB_00a18f6b;
  }
  testing::Message::Message((Message *)&local_50);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_80,(internal *)local_f0,
             (AssertionResult *)
             "Run(absl::StrCat(args, \" --encode=proto2_unittest.TestAllTypes\"))","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x11c7,(char *)local_80._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
  if ((AlphaNum *)local_80._0_8_ != (AlphaNum *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((long *)local_50.piece_._M_len != (long *)0x0) {
    (**(code **)(*(long *)local_50.piece_._M_len + 8))();
  }
LAB_00a18f6b:
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  EncodeDecodeTest::ExpectStdoutMatchesBinaryFile(&this->super_EncodeDecodeTest,&local_a0);
  EncodeDecodeTest::ExpectNoErrors(&this->super_EncodeDecodeTest);
  if ((char *)local_d0.piece_._M_len != pcVar1) {
    operator_delete((void *)local_d0.piece_._M_len,
                    CONCAT71(local_d0.digits_._1_7_,local_d0.digits_[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Encode) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(
      Run(absl::StrCat(args, " --encode=proto2_unittest.TestAllTypes")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}